

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLCompiledProgram::addUniqueUniform
          (GLCompiledProgram *this,ShaderSpecUniform *newUniform)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  GLShaderUniform *u;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
  *__range2;
  value_type *in_stack_ffffffffffffff28;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>_>
  *in_stack_ffffffffffffff30;
  size_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_a8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  string *in_stack_ffffffffffffff90;
  string local_50 [32];
  reference local_30;
  GLShaderUniform *local_28;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>_>
  local_20;
  size_type *local_18;
  
  local_18 = &in_RDI->_M_string_length;
  local_20._M_current =
       (GLShaderUniform *)
       std::
       vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
       ::begin((vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
                *)in_stack_ffffffffffffff28);
  local_28 = (GLShaderUniform *)
             std::
             vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
             ::end((vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
                    *)in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff30,
                       (__normal_iterator<polyscope::render::backend_openGL_mock::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) {
      this_00 = &in_RDI->_M_string_length;
      std::__cxx11::string::string(local_a8,(string *)in_RSI);
      std::
      vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
      ::push_back((vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
                   *)this_00,in_stack_ffffffffffffff28);
      GLShaderUniform::~GLShaderUniform((GLShaderUniform *)0x512cd5);
      return;
    }
    local_30 = __gnu_cxx::
               __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>_>
               ::operator*(&local_20);
    _Var2 = std::operator==(in_RDI,in_RSI);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>_>
    ::operator++(&local_20);
  }
  if (local_30->type == *(RenderDataType *)(in_RSI + 1)) {
    return;
  }
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff70);
  std::operator+(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
  exception(in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  return;
}

Assistant:

void GLCompiledProgram::addUniqueUniform(ShaderSpecUniform newUniform) {
  for (GLShaderUniform& u : uniforms) {
    if (u.name == newUniform.name) {

      // if it occurs twice, confirm that the occurences match
      if (u.type != newUniform.type) exception("uniform " + u.name + " appears twice in program with different types");

      return;
    }
  }
  uniforms.push_back(GLShaderUniform{newUniform.name, newUniform.type, false});
}